

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ahocorasick.c
# Opt level: O1

AC_STATUS_t ac_trie_add(AC_TRIE_t *thiz,AC_PATTERN_t *patt,int copy)

{
  AC_ALPHABET_t alpha;
  ACT_NODE_t *nod;
  AC_STATUS_t AVar1;
  ulong uVar2;
  ACT_NODE_t *nod_00;
  
  if (thiz->trie_open == 0) {
    AVar1 = ACERR_TRIE_CLOSED;
  }
  else {
    uVar2 = (patt->ptext).length;
    if (uVar2 == 0) {
      AVar1 = ACERR_ZERO_PATTERN;
    }
    else {
      AVar1 = ACERR_LONG_PATTERN;
      if (uVar2 < 0x401) {
        nod = thiz->root;
        if ((patt->ptext).length != 0) {
          uVar2 = 0;
          nod_00 = nod;
          do {
            alpha = (patt->ptext).astring[uVar2];
            nod = node_find_next(nod_00,alpha);
            if (nod == (ACT_NODE_t *)0x0) {
              nod = node_create_next(nod_00,alpha);
              nod->depth = nod_00->depth + 1;
            }
            uVar2 = uVar2 + 1;
            nod_00 = nod;
          } while (uVar2 < (patt->ptext).length);
        }
        AVar1 = ACERR_DUPLICATE_PATTERN;
        if (nod->final == 0) {
          nod->final = 1;
          node_accept_pattern(nod,patt,copy);
          thiz->patterns_count = thiz->patterns_count + 1;
          AVar1 = ACERR_SUCCESS;
        }
      }
    }
  }
  return AVar1;
}

Assistant:

AC_STATUS_t ac_trie_add (AC_TRIE_t *thiz, AC_PATTERN_t *patt, int copy)
{
    size_t i;
    ACT_NODE_t *n = thiz->root;
    ACT_NODE_t *next;
    AC_ALPHABET_t alpha;
    
    if(!thiz->trie_open)
        return ACERR_TRIE_CLOSED;
    
    if (!patt->ptext.length)
        return ACERR_ZERO_PATTERN;
    
    if (patt->ptext.length > AC_PATTRN_MAX_LENGTH)
        return ACERR_LONG_PATTERN;
    
    for (i = 0; i < patt->ptext.length; i++)
    {
        alpha = patt->ptext.astring[i];
        if ((next = node_find_next (n, alpha)))
        {
            n = next;
            continue;
        }
        else
        {
            next = node_create_next (n, alpha);
            next->depth = n->depth + 1;
            n = next;
        }
    }
    
    if(n->final)
        return ACERR_DUPLICATE_PATTERN;
    
    n->final = 1;
    node_accept_pattern (n, patt, copy);
    thiz->patterns_count++;
    
    return ACERR_SUCCESS;
}